

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O1

resource loader::anon_unknown_0::ne_reader::find_resource(istream *is,uint32_t name,uint32_t type)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  char buffer [2];
  ushort local_46;
  uint local_44;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  std::istream::seekg((long)is,0x22);
  std::istream::read((char *)is,(long)&local_46);
  uVar7 = local_46;
  uVar8 = (uint)local_46;
  std::istream::read((char *)is,(long)&local_46);
  uVar6 = 0;
  if (local_46 != uVar7) {
    local_38 = 0;
    if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0)
    goto LAB_00133aa7;
    std::istream::seekg((long)is,uVar8 - 0x28);
    std::istream::read((char *)is,(long)&local_46);
    uVar6 = 0;
    local_40 = (uint)local_46;
    if (local_40 < 0x20) {
      local_38 = 0;
      if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0)
      goto LAB_00133aa7;
      do {
        std::istream::read((char *)is,(long)&local_46);
        uVar2 = local_46;
        std::istream::read((char *)is,(long)&local_46);
        uVar7 = local_46;
        std::istream::seekg((long)is,4);
        iVar5 = 1;
        if (((uVar2 != 0) &&
            (iVar5 = 1, (*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) == 0))
           && (iVar5 = 2, (type & 0xffff | 0x8000) != (uint)uVar2)) {
          std::istream::seekg((long)is,(uint)uVar7 * 0xc);
          iVar5 = 0;
        }
      } while (iVar5 == 0);
      if (iVar5 == 2) {
        local_38 = 0;
        if (uVar7 == 0) {
          uVar6 = 0;
        }
        else {
          local_38 = 0;
          local_3c = name & 0xffff | 0x8000;
          local_44 = 0;
          do {
            uVar7 = uVar7 - 1;
            std::istream::read((char *)is,(long)&local_46);
            uVar2 = local_46;
            std::istream::read((char *)is,(long)&local_46);
            uVar3 = local_46;
            std::istream::seekg((long)is,_S_end);
            std::istream::read((char *)is,(long)&local_46);
            uVar4 = local_46;
            std::istream::seekg((long)is,4);
            bVar1 = true;
            if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
              if (local_3c == uVar4) {
                local_44 = (uint)uVar2 << ((byte)local_40 & 0x1f);
                local_38 = (ulong)((uint)uVar3 << ((byte)local_40 & 0x1f));
              }
              else {
                bVar1 = false;
              }
            }
          } while ((!bVar1) && (uVar7 != 0));
          local_38 = local_38 << 0x20;
          uVar6 = (ulong)local_44;
        }
        goto LAB_00133aa7;
      }
    }
  }
  uVar6 = 0;
  local_38 = 0;
LAB_00133aa7:
  return (resource)(uVar6 | local_38);
}

Assistant:

exe_reader::resource ne_reader::find_resource(std::istream & is, boost::uint32_t name,
                                              boost::uint32_t type) {
	
	resource result;
	result.offset = result.size = 0;
	
	is.seekg(0x24 - 2, std::ios_base::cur); // Already read the magic
	boost::uint16_t resources_offset = util::load<boost::uint16_t>(is);
	boost::uint16_t resources_end = util::load<boost::uint16_t>(is);
	if(is.fail()) {
		return result;
	}
	
	if(resources_end == resources_offset) {
		return result;
	}
	
	is.seekg(std::streamoff(resources_offset) - 0x28, std::ios_base::cur);
	
	boost::uint16_t shift = util::load<boost::uint16_t>(is);
	if(is.fail() || shift >= 32) {
		return result;
	}
	
	boost::uint16_t name_count;
	for(;;) {
		
		boost::uint16_t type_id = util::load<boost::uint16_t>(is);
		name_count = util::load<boost::uint16_t>(is);
		is.seekg(4, std::ios_base::cur);
		if(is.fail() || type_id == 0) {
			return result;
		}
		
		if(type_id == boost::uint16_t(type | 0x8000)) {
			break;
		}
		
		is.seekg(name_count * 12, std::ios_base::cur);
		
	}
	
	for(boost::uint16_t i = 0; i < name_count; i++) {
		
		boost::uint16_t offset = util::load<boost::uint16_t>(is);
		boost::uint16_t size   = util::load<boost::uint16_t>(is);
		is.seekg(2, std::ios_base::cur);
		boost::uint16_t name_id = util::load<boost::uint16_t>(is);
		is.seekg(4, std::ios_base::cur);
		if(is.fail()) {
			return result;
		}
		
		if(name_id == boost::uint16_t(name | 0x8000)) {
			result.offset = boost::uint32_t(offset) << shift;
			result.size   = boost::uint32_t(size)   << shift;
			break;
		}
		
	}
	
	return result;
}